

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

int send_close_frame(CONNECTION_HANDLE connection,ERROR_HANDLE error_handle)

{
  int iVar1;
  CLOSE_HANDLE close;
  LOGGER_LOG p_Var2;
  AMQP_VALUE performative;
  int iVar3;
  char *pcVar4;
  
  close = close_create();
  if (close == (CLOSE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1ce;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
              ,"send_close_frame",0x1cd,1,"Cannot create close performative");
    return 0x1ce;
  }
  if ((error_handle == (ERROR_HANDLE)0x0) ||
     (iVar1 = close_set_error(close,error_handle), iVar1 == 0)) {
    performative = amqpvalue_create_close(close);
    if (performative != (AMQP_VALUE)0x0) {
      connection->on_send_complete = (ON_SEND_COMPLETE)0x0;
      connection->on_send_complete_callback_context = (void *)0x0;
      iVar1 = amqp_frame_codec_encode_frame
                        (connection->amqp_frame_codec,0,performative,(PAYLOAD *)0x0,0,
                         on_bytes_encoded,connection);
      if (iVar1 == 0) {
        iVar1 = 0;
        if ((connection->field_0xe0 & 8) != 0) {
          log_outgoing_frame(performative);
          iVar1 = 0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x1ea;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                    ,"send_close_frame",0x1e9,1,"amqp_frame_codec_encode_frame failed");
        }
      }
      amqpvalue_destroy(performative);
      goto LAB_0010f3ac;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1df;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010f3ac;
    pcVar4 = "Cannot create AMQP CLOSE performative value";
    iVar3 = 0x1de;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1d7;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010f3ac;
    pcVar4 = "Cannot set error on CLOSE";
    iVar3 = 0x1d6;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
            ,"send_close_frame",iVar3,1,pcVar4);
LAB_0010f3ac:
  close_destroy(close);
  return iVar1;
}

Assistant:

static int send_close_frame(CONNECTION_HANDLE connection, ERROR_HANDLE error_handle)
{
    int result;
    CLOSE_HANDLE close_performative;

    /* Codes_S_R_S_CONNECTION_01_217: [The CLOSE frame shall be constructed by using close_create.] */
    close_performative = close_create();
    if (close_performative == NULL)
    {
        LogError("Cannot create close performative");
        result = MU_FAILURE;
    }
    else
    {
        if ((error_handle != NULL) &&
            /* Codes_S_R_S_CONNECTION_01_238: [If set, this field indicates that the connection is being closed due to an error condition.] */
            (close_set_error(close_performative, error_handle) != 0))
        {
            LogError("Cannot set error on CLOSE");
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE close_performative_value = amqpvalue_create_close(close_performative);
            if (close_performative_value == NULL)
            {
                LogError("Cannot create AMQP CLOSE performative value");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_S_R_S_CONNECTION_01_215: [Sending the AMQP CLOSE frame shall be done by calling amqp_frame_codec_begin_encode_frame with channel number 0, the actual performative payload and 0 as payload_size.] */
                /* Codes_S_R_S_CONNECTION_01_013: [However, implementations SHOULD send it on channel 0] */
                connection->on_send_complete = NULL;
                connection->on_send_complete_callback_context = NULL;
                if (amqp_frame_codec_encode_frame(connection->amqp_frame_codec, 0, close_performative_value, NULL, 0, on_bytes_encoded, connection) != 0)
                {
                    LogError("amqp_frame_codec_encode_frame failed");
                    result = MU_FAILURE;
                }
                else
                {
                    if (connection->is_trace_on == 1)
                    {
                        log_outgoing_frame(close_performative_value);
                    }

                    result = 0;
                }

                amqpvalue_destroy(close_performative_value);
            }
        }

        close_destroy(close_performative);
    }

    return result;
}